

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

void glfwSetGamma(GLFWmonitor *handle,float gamma)

{
  GLFWgammaramp *pGVar1;
  unsigned_short *__ptr;
  ulong __nmemb;
  ulong uVar2;
  float fVar3;
  GLFWgammaramp ramp;
  GLFWgammaramp local_48;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if ((0.0 < gamma) && (gamma <= 3.4028235e+38)) {
    pGVar1 = glfwGetGammaRamp(handle);
    if (pGVar1 != (GLFWgammaramp *)0x0) {
      __nmemb = (ulong)pGVar1->size;
      __ptr = (unsigned_short *)calloc(__nmemb,2);
      if (__nmemb == 0) {
        local_48.size = 0;
      }
      else {
        uVar2 = 0;
        do {
          fVar3 = powf((float)(uVar2 & 0xffffffff) / (float)((int)__nmemb - 1),1.0 / gamma);
          fVar3 = _glfw_fminf(fVar3 * 65535.0 + 0.5,65535.0);
          __ptr[uVar2] = (unsigned_short)(int)fVar3;
          uVar2 = uVar2 + 1;
          local_48.size = pGVar1->size;
          __nmemb = (ulong)local_48.size;
        } while (uVar2 < __nmemb);
      }
      local_48.red = __ptr;
      local_48.green = __ptr;
      local_48.blue = __ptr;
      glfwSetGammaRamp(handle,&local_48);
      free(__ptr);
    }
    return;
  }
  _glfwInputError(0x10004,"Invalid gamma value %f",(double)gamma);
  return;
}

Assistant:

GLFWAPI void glfwSetGamma(GLFWmonitor* handle, float gamma)
{
    unsigned int i;
    unsigned short* values;
    GLFWgammaramp ramp;
    const GLFWgammaramp* original;
    assert(handle != NULL);
    assert(gamma > 0.f);
    assert(gamma <= FLT_MAX);

    _GLFW_REQUIRE_INIT();

    if (gamma != gamma || gamma <= 0.f || gamma > FLT_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid gamma value %f", gamma);
        return;
    }

    original = glfwGetGammaRamp(handle);
    if (!original)
        return;

    values = calloc(original->size, sizeof(unsigned short));

    for (i = 0;  i < original->size;  i++)
    {
        float value;

        // Calculate intensity
        value = i / (float) (original->size - 1);
        // Apply gamma curve
        value = powf(value, 1.f / gamma) * 65535.f + 0.5f;
        // Clamp to value range
        value = _glfw_fminf(value, 65535.f);

        values[i] = (unsigned short) value;
    }

    ramp.red = values;
    ramp.green = values;
    ramp.blue = values;
    ramp.size = original->size;

    glfwSetGammaRamp(handle, &ramp);
    free(values);
}